

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score_test.cc
# Opt level: O0

void __thiscall
xLearn::FMScoreTest_calc_score_overflow_Test::~FMScoreTest_calc_score_overflow_Test
          (FMScoreTest_calc_score_overflow_Test *this)

{
  void *in_RDI;
  
  ~FMScoreTest_calc_score_overflow_Test((FMScoreTest_calc_score_overflow_Test *)0x13c208);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FMScoreTest, calc_score_overflow) {
  for (index_t k = 1; k < 100; ++k) {
    // Init hyper_param
    HyperParam param;
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.loss_func = "squared";
    param.score_func = "fm";
    param.num_feature = 3;
    param.num_K = k;
    param.num_field = 3;
    // Init SparseRow
    SparseRow row(param.num_feature*2);
    for (index_t i = 0; i < param.num_feature*2; ++i) {
      row[i].feat_id = i;
      row[i].feat_val = 2.0;
    }
    // Init model
    Model model;
    model.Initialize(param.score_func,
                param.loss_func,
                param.num_feature,
                param.num_field,
                param.num_K, 2);
    real_t* w = model.GetParameter_w();
    index_t num_w = model.GetNumParameter_w();
    for (index_t i = 0; i < num_w; ++i) {
      w[i] = 1.0;
    }
    real_t* v = model.GetParameter_v();
    index_t k_aligned = model.get_aligned_k();
    for (index_t j = 0; j < model.GetNumFeature(); ++j) {
      for(index_t d = 0; d < model.GetNumK(); d++, v++)
        *v = 1.0;
      for(index_t d = model.GetNumK(); d < k_aligned; d++, v++)
        *v = 0;
      for(index_t d = k_aligned; d < 2*k_aligned; d++, v++)
        *v = 1.0;
    }
    model.GetParameter_b()[0] = 0.0;
    FMScore score;
    for (size_t i = 0; i < 10; ++i) {
      real_t val = score.CalcScore(&row, model);
      EXPECT_FLOAT_EQ(val, 6+k*4*3);
    }
  }
}